

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O1

Index __thiscall wabt::anon_unknown_1::WatWriter::GetLabelArity(WatWriter *this,Var *var)

{
  pointer pLVar1;
  pointer __s2;
  size_t sVar2;
  size_t __n;
  TypeVector *pTVar3;
  TypeVector *pTVar4;
  int iVar5;
  Index IVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  pointer unaff_R14;
  pointer pLVar10;
  bool bVar11;
  
  if (var->type_ == Index) {
    pLVar10 = (this->label_stack_).
              super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = (int)((ulong)((long)(this->label_stack_).
                                super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar10) >> 3) *
            -0x45d1745d;
    if ((var->field_2).index_ < uVar7) {
      pLVar10 = pLVar10 + (uVar7 + ~(var->field_2).index_);
      goto LAB_00f7da64;
    }
  }
  else {
    if (var->type_ != Name) {
      __assert_fail("is_index()",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/ir.h"
                    ,0x36,"Index wabt::Var::index() const");
    }
    pLVar1 = (this->label_stack_).
             super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
             ._M_impl.super__Vector_impl_data._M_start;
    __s2 = (var->field_2).name_._M_dataplus._M_p;
    sVar2 = (var->field_2).name_._M_string_length;
    lVar8 = (ulong)(uint)((int)((ulong)((long)(this->label_stack_).
                                              super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pLVar1) >> 3) * -0x45d1745d) * 0x58;
    do {
      lVar9 = lVar8 + -0x58;
      pLVar10 = unaff_R14;
      if (lVar9 == -0x58) break;
      pLVar10 = (pointer)((long)&pLVar1[-1].name._M_dataplus._M_p + lVar8);
      __n = *(size_t *)((long)pLVar1 + lVar8 + -0x50);
      if (__n == sVar2) {
        if (__n == 0) {
          bVar11 = true;
        }
        else {
          iVar5 = bcmp((pLVar10->name)._M_dataplus._M_p,__s2,__n);
          bVar11 = iVar5 == 0;
        }
      }
      else {
        bVar11 = false;
      }
      lVar8 = lVar9;
    } while (!bVar11);
    if (lVar9 != -0x58) goto LAB_00f7da64;
  }
  pLVar10 = (pointer)0x0;
LAB_00f7da64:
  if (pLVar10 == (pointer)0x0) {
    IVar6 = 0;
  }
  else {
    pTVar3 = &pLVar10->param_types;
    pTVar4 = &pLVar10->param_types;
    if (pLVar10->label_type != Loop) {
      pTVar3 = &pLVar10->result_types;
      pTVar4 = &pLVar10->result_types;
    }
    IVar6 = (Index)((ulong)((long)*(pointer *)
                                   ((long)&pTVar4->
                                           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                   + 8) -
                           *(long *)&(pTVar3->
                                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                                     _M_impl.super__Vector_impl_data) >> 2);
  }
  return IVar6;
}

Assistant:

Index WatWriter::GetLabelArity(const Var& var) {
  Label* label = GetLabel(var);
  if (!label) {
    return 0;
  }

  return label->label_type == LabelType::Loop ? label->param_types.size()
                                              : label->result_types.size();
}